

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O1

char * __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_0::PrintIntegralDigitsFromRightFast
          (anon_unknown_0 *this,uint128 v,char *p)

{
  ulong uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  char *pcVar4;
  ulong uVar5;
  
  pcVar4 = (char *)v.hi_;
  uVar5 = v.lo_;
  if (uVar5 != 0) {
    do {
      uVar1 = (ulong)this % 10 + (uVar5 % 10) * 6;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar1;
      this = (anon_unknown_0 *)((uVar5 % 10) * 0x1999999999999999 + (ulong)this / 10 + uVar1 / 10);
      pcVar4[-1] = (char)uVar1 + SUB161(auVar3 * ZEXT816(0x199999999999999a),8) * -10 | 0x30;
      pcVar4 = pcVar4 + -1;
      bVar2 = 9 < uVar5;
      uVar5 = uVar5 / 10;
    } while (bVar2);
  }
  do {
    pcVar4[-1] = (char)this + (char)(anon_unknown_0 *)((ulong)this / 10) * -10 | 0x30;
    pcVar4 = pcVar4 + -1;
    bVar2 = (anon_unknown_0 *)0x9 < this;
    this = (anon_unknown_0 *)((ulong)this / 10);
  } while (bVar2);
  return pcVar4;
}

Assistant:

char *PrintIntegralDigitsFromRightFast(uint128 v, char *p) {
  auto high = static_cast<uint64_t>(v >> 64);
  auto low = static_cast<uint64_t>(v);

  while (high != 0) {
    char carry = DivideBy10WithCarry(&high, 0);
    carry = DivideBy10WithCarry(&low, carry);
    *--p = carry + '0';
  }
  return PrintIntegralDigitsFromRightFast(low, p);
}